

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.cpp
# Opt level: O1

optional<uint256> *
node::ReadSnapshotBaseBlockhash(optional<uint256> *__return_storage_ptr__,path chaindir)

{
  pointer *ppbVar1;
  long lVar2;
  pointer pcVar3;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  char cVar4;
  bool bVar5;
  FILE *file;
  int64_t iVar6;
  int64_t iVar7;
  size_t in_RCX;
  path *in_RSI;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  void *pvVar8;
  long lVar9;
  AutoFile afile;
  uint256 base_blockhash;
  string read_from_str;
  path local_88;
  path read_from;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = std::filesystem::status((path *)in_RSI);
  if ((cVar4 == -1) || (cVar4 == '\0')) {
    pcVar3 = (in_RSI->_M_pathname)._M_dataplus._M_p;
    ppbVar1 = &afile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish;
    afile.m_file = (FILE *)ppbVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&afile,pcVar3,pcVar3 + (in_RSI->_M_pathname)._M_string_length);
    logging_function._M_str = "ReadSnapshotBaseBlockhash";
    logging_function._M_len = 0x19;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
    ;
    source_file._M_len = 0x66;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x35,ALL,Info,(ConstevalFormatString<1U>)0x82de7a,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&afile);
    if (afile.m_file != (FILE *)ppbVar1) {
      operator_delete(afile.m_file,
                      (ulong)(afile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
    }
    (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
  }
  else {
    std::filesystem::__cxx11::path::path(&local_88,in_RSI);
    std::filesystem::__cxx11::path::operator/=(&local_88,(path *)SNAPSHOT_BLOCKHASH_FILENAME);
    std::filesystem::__cxx11::path::path(&read_from.super_path,&local_88);
    std::filesystem::__cxx11::path::~path(&local_88);
    read_from_str._M_dataplus._M_p = (pointer)&read_from_str.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&read_from_str,read_from.super_path._M_pathname._M_dataplus._M_p,
               read_from.super_path._M_pathname._M_dataplus._M_p +
               read_from.super_path._M_pathname._M_string_length);
    cVar4 = std::filesystem::status((path *)&read_from);
    if ((cVar4 == -1) || (cVar4 == '\0')) {
      pcVar3 = (in_RSI->_M_pathname)._M_dataplus._M_p;
      ppbVar1 = &afile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      afile.m_file = (FILE *)ppbVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&afile,pcVar3,pcVar3 + (in_RSI->_M_pathname)._M_string_length);
      logging_function_00._M_str = "ReadSnapshotBaseBlockhash";
      logging_function_00._M_len = 0x19;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
      ;
      source_file_00._M_len = 0x66;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (logging_function_00,source_file_00,0x3e,ALL,Info,
                 (ConstevalFormatString<2U>)0x82dec6,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&afile,
                 &read_from_str);
      if (afile.m_file != (FILE *)ppbVar1) {
        operator_delete(afile.m_file,
                        (ulong)(afile.m_xor.
                                super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                super__Vector_impl_data._M_finish + 1));
      }
      (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
      super__Optional_payload_base<uint256>._M_engaged = false;
    }
    else {
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      file = fsbridge::fopen((char *)&read_from,"rb");
      pvVar8 = (void *)0x0;
      lVar9 = 0;
      data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      AutoFile::AutoFile(&afile,(FILE *)file,data_xor);
      if (pvVar8 != (void *)0x0) {
        operator_delete(pvVar8,lVar9 - (long)pvVar8);
      }
      if (afile.m_file == (FILE *)0x0) {
        logging_function_02._M_str = "ReadSnapshotBaseBlockhash";
        logging_function_02._M_len = 0x19;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
        ;
        source_file_02._M_len = 0x66;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_02,source_file_02,0x47,ALL,Info,
                   (ConstevalFormatString<1U>)0x82df52,&read_from_str);
        bVar5 = false;
      }
      else {
        AutoFile::read(&afile,(int)&base_blockhash,(void *)0x20,in_RCX);
        iVar6 = AutoFile::tell(&afile);
        AutoFile::seek(&afile,0,2);
        iVar7 = AutoFile::tell(&afile);
        if (iVar6 != iVar7) {
          logging_function_01._M_str = "ReadSnapshotBaseBlockhash";
          logging_function_01._M_len = 0x19;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
          ;
          source_file_01._M_len = 0x66;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_01,source_file_01,0x4f,ALL,Info,
                     (ConstevalFormatString<1U>)0x82df91,&read_from_str);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
                 super__Optional_payload_base<uint256>._M_payload + 0x10) =
             base_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
                 super__Optional_payload_base<uint256>._M_payload + 0x18) =
             base_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
          super__Optional_payload_base<uint256>._M_payload =
             base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
                 super__Optional_payload_base<uint256>._M_payload + 8) =
             base_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_;
        bVar5 = true;
      }
      (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
      super__Optional_payload_base<uint256>._M_engaged = bVar5;
      AutoFile::~AutoFile(&afile);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)read_from_str._M_dataplus._M_p != &read_from_str.field_2) {
      operator_delete(read_from_str._M_dataplus._M_p,read_from_str.field_2._M_allocated_capacity + 1
                     );
    }
    std::filesystem::__cxx11::path::~path(&read_from.super_path);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint256> ReadSnapshotBaseBlockhash(fs::path chaindir)
{
    if (!fs::exists(chaindir)) {
        LogPrintf("[snapshot] cannot read base blockhash: no chainstate dir "
            "exists at path %s\n", fs::PathToString(chaindir));
        return std::nullopt;
    }
    const fs::path read_from = chaindir / node::SNAPSHOT_BLOCKHASH_FILENAME;
    const std::string read_from_str = fs::PathToString(read_from);

    if (!fs::exists(read_from)) {
        LogPrintf("[snapshot] snapshot chainstate dir is malformed! no base blockhash file "
            "exists at path %s. Try deleting %s and calling loadtxoutset again?\n",
            fs::PathToString(chaindir), read_from_str);
        return std::nullopt;
    }

    uint256 base_blockhash;
    FILE* file{fsbridge::fopen(read_from, "rb")};
    AutoFile afile{file};
    if (afile.IsNull()) {
        LogPrintf("[snapshot] failed to open base blockhash file for reading: %s\n",
            read_from_str);
        return std::nullopt;
    }
    afile >> base_blockhash;

    int64_t position = afile.tell();
    afile.seek(0, SEEK_END);
    if (position != afile.tell()) {
        LogPrintf("[snapshot] warning: unexpected trailing data in %s\n", read_from_str);
    }
    return base_blockhash;
}